

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O0

Time __thiscall Storage::Tape::Tape::get_current_time(Tape *this)

{
  int iVar1;
  undefined4 extraout_var;
  long local_20;
  uint64_t steps;
  Tape *this_local;
  Time time;
  
  Time::Time((Time *)&this_local,0);
  iVar1 = (*this->_vptr_Tape[1])();
  reset(this);
  local_20 = CONCAT44(extraout_var,iVar1);
  while (local_20 != 0) {
    get_next_pulse(this);
    Time::operator+=((Time *)&this_local,&(this->pulse_).length);
    local_20 = local_20 + -1;
  }
  return (Time)this_local;
}

Assistant:

Storage::Time Tape::get_current_time() {
	Time time(0);
	uint64_t steps = get_offset();
	reset();
	while(steps--) {
		get_next_pulse();
		time += pulse_.length;
	}
	return time;
}